

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O3

void cdns_debug_dump(void)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  char buf [55];
  
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3c0,
             "cdns_debug_dump",0,6,"Dumping data for DNS servers:");
  if (g_svr_count != 0) {
    lVar3 = 0xa4;
    uVar2 = 0;
    do {
      pcVar1 = fmt_sockaddr_port((sockaddr *)((long)g_svr_cfg + lVar3 + -0x94),buf,0x37);
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3c8
                 ,"cdns_debug_dump",0,6,"DNS %s: rsp/req: %u/%u avg rtt: %ums",pcVar1,
                 (ulong)*(uint *)((g_svr_cfg->addr).__ss_padding + lVar3 + -0x1a),
                 (ulong)*(uint *)((g_svr_cfg->addr).__ss_padding + lVar3 + -0x1e),
                 (ulong)*(uint *)((g_svr_cfg->addr).__ss_padding + lVar3 + -0x12));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0xe8;
    } while (uVar2 < g_svr_count);
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x3ca,
             "cdns_debug_dump",0,6,"End of data dumping.");
  return;
}

Assistant:

void cdns_debug_dump()
{
    char buf[INET_ADDR_PORT_STRLEN];

    log_error(LOG_INFO, "Dumping data for DNS servers:");

    for (int i = 0; i < g_svr_count; i++) {
        log_error(LOG_INFO, "DNS %s: rsp/req: %u/%u avg rtt: %ums",
                            fmt_sockaddr_port((struct sockaddr *)&g_svr_cfg[i].addr,
                                              &buf[0], sizeof(buf)),
                            g_svr_cfg[i].stats.n_rsp,
                            g_svr_cfg[i].stats.n_req,
                            g_svr_cfg[i].stats.avg_rtt);
    }
    log_error(LOG_INFO, "End of data dumping.");

}